

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O1

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  size_t sVar14;
  long lVar15;
  char *pcVar16;
  uint uVar17;
  long *plVar18;
  uint uVar19;
  Bac_Ntk_t *p;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 local_40;
  
  puVar9 = (undefined8 *)pAbc->pAbcBac;
  local_40 = 0;
  Extra_UtilGetoptReset();
  bVar10 = false;
  do {
    while (iVar11 = Extra_UtilGetopt(argc,argv,"Mvh"), iVar12 = globalUtilOptind, iVar11 == 0x76) {
      bVar10 = (bool)(bVar10 ^ 1);
    }
    if (iVar11 == -1) {
      if (puVar9 == (undefined8 *)0x0) {
        Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
        return 0;
      }
      iVar12 = *(int *)(puVar9 + 4);
      uVar17 = 0;
      if (((long)iVar12 < 1) || (*(int *)((long)puVar9 + 0x24) < iVar12)) {
        lVar15 = 0;
      }
      else {
        lVar15 = (long)iVar12 * 0xd0 + puVar9[5];
      }
      printf("%-12s : ",*puVar9);
      printf("pi =%5d  ",(ulong)*(uint *)(lVar15 + 0x24));
      printf("po =%5d  ",(ulong)*(uint *)(lVar15 + 0x34));
      iVar12 = Abc_NamObjNumMax((Abc_Nam_t *)puVar9[3]);
      printf("pri =%4d  ",(ulong)(uint)(iVar12 - *(int *)((long)puVar9 + 0x24)));
      printf("mod =%6d  ",(ulong)*(uint *)((long)puVar9 + 0x24));
      if (0 < (int)*(uint *)((long)puVar9 + 0x24)) {
        uVar17 = 0;
        lVar15 = 1;
        do {
          iVar12 = *(int *)(puVar9[5] + 0x54 + lVar15 * 0xd0);
          iVar11 = 0;
          if (0 < (long)iVar12) {
            lVar20 = 0;
            iVar11 = 0;
            do {
              bVar1 = *(byte *)(*(long *)(lVar15 * 0xd0 + puVar9[5] + 0x58) + lVar20);
              if ((char)bVar1 < '\0') goto LAB_003b22eb;
              iVar11 = iVar11 + (uint)(bVar1 < 10);
              lVar20 = lVar20 + 1;
            } while (iVar12 != lVar20);
          }
          uVar17 = (uVar17 + iVar12) - iVar11;
          lVar15 = lVar15 + 1;
        } while (lVar15 != (ulong)*(uint *)((long)puVar9 + 0x24) + 1);
      }
      uVar19 = 0;
      printf("box =%7d  ",(ulong)uVar17);
      if (0 < (int)*(uint *)((long)puVar9 + 0x24)) {
        lVar15 = 0;
        uVar19 = 0;
        do {
          uVar19 = uVar19 + *(int *)(puVar9[5] + 0x124 + lVar15);
          lVar15 = lVar15 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar9 + 0x24) * 0xd0 - lVar15 != 0);
      }
      printf("obj =%7d  ",(ulong)uVar19);
      if ((char *)*puVar9 == (char *)0x0) {
        iVar12 = 0x530;
      }
      else {
        sVar14 = strlen((char *)*puVar9);
        iVar12 = (int)sVar14 + 0x530;
      }
      if ((char *)puVar9[1] != (char *)0x0) {
        sVar14 = strlen((char *)puVar9[1]);
        iVar12 = iVar12 + (int)sVar14;
      }
      iVar11 = Abc_NamMemUsed((Abc_Nam_t *)puVar9[2]);
      iVar13 = Abc_NamMemUsed((Abc_Nam_t *)puVar9[3]);
      iVar13 = iVar13 + iVar11 + iVar12;
      if (0 < (int)*(uint *)((long)puVar9 + 0x24)) {
        lVar15 = puVar9[5];
        lVar20 = 0;
        do {
          iVar12 = *(int *)(lVar15 + 0xf0 + lVar20);
          auVar22._8_4_ = iVar12 >> 0x1f;
          auVar22._0_8_ = (long)iVar12;
          auVar22._12_4_ = 0x45300000;
          iVar11 = *(int *)(lVar15 + 0x100 + lVar20);
          auVar23._8_4_ = iVar11 >> 0x1f;
          auVar23._0_8_ = (long)iVar11;
          auVar23._12_4_ = 0x45300000;
          iVar2 = *(int *)(lVar15 + 0x110 + lVar20);
          auVar24._8_4_ = iVar2 >> 0x1f;
          auVar24._0_8_ = (long)iVar2;
          auVar24._12_4_ = 0x45300000;
          iVar3 = *(int *)(lVar15 + 0x120 + lVar20);
          auVar25._8_4_ = iVar3 >> 0x1f;
          auVar25._0_8_ = (long)iVar3;
          auVar25._12_4_ = 0x45300000;
          iVar4 = *(int *)(lVar15 + 0x130 + lVar20);
          auVar26._8_4_ = iVar4 >> 0x1f;
          auVar26._0_8_ = (long)iVar4;
          auVar26._12_4_ = 0x45300000;
          iVar5 = *(int *)(lVar15 + 0x140 + lVar20);
          auVar27._8_4_ = iVar5 >> 0x1f;
          auVar27._0_8_ = (long)iVar5;
          auVar27._12_4_ = 0x45300000;
          iVar6 = *(int *)(lVar15 + 0x150 + lVar20);
          auVar28._8_4_ = iVar6 >> 0x1f;
          auVar28._0_8_ = (long)iVar6;
          auVar28._12_4_ = 0x45300000;
          iVar7 = *(int *)(lVar15 + 0x160 + lVar20);
          auVar29._8_4_ = iVar7 >> 0x1f;
          auVar29._0_8_ = (long)iVar7;
          auVar29._12_4_ = 0x45300000;
          iVar8 = *(int *)(lVar15 + 0x170 + lVar20);
          auVar30._8_4_ = iVar8 >> 0x1f;
          auVar30._0_8_ = (long)iVar8;
          auVar30._12_4_ = 0x45300000;
          iVar13 = (int)(((auVar30._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar29._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar28._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar27._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar26._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)((auVar25._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0) + 16.0) +
                   (int)(((auVar24._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar23._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar11) - 4503599627370496.0)) * 4.0 + 16.0) +
                   (int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar12) - 4503599627370496.0)) * 4.0 + 16.0) +
                   iVar13 + 0xd0;
          lVar20 = lVar20 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar9 + 0x24) * 0xd0 - lVar20 != 0);
      }
      printf("mem =%6.3f MB",(double)iVar13 * 9.5367431640625e-07);
      putchar(10);
      uVar17 = *(uint *)((long)puVar9 + 0x24);
      if (0 < (int)uVar17) {
        lVar15 = puVar9[5];
        lVar20 = 0;
        do {
          *(undefined4 *)(lVar15 + 0xe8 + lVar20) = 0xffffffff;
          lVar20 = lVar20 + 0xd0;
        } while ((ulong)uVar17 * 0xd0 - lVar20 != 0);
      }
      uVar19 = *(uint *)(puVar9 + 4);
      if ((int)uVar17 < (int)uVar19 || (int)uVar19 < 1) {
        p = (Bac_Ntk_t *)0x0;
      }
      else {
        p = (Bac_Ntk_t *)((ulong)uVar19 * 0xd0 + puVar9[5]);
      }
      Bac_ManBoxNum_rec(p);
      if (*(int *)((long)puVar9 + 0x24) < 1) {
        return 0;
      }
      uVar21 = 1;
      do {
        if (uVar21 == (int)local_40 + 1) {
          return 0;
        }
        plVar18 = (long *)(uVar21 * 0xd0 + puVar9[5]);
        iVar11 = 0;
        printf("Module %5d : ",uVar21 & 0xffffffff);
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar18 + 0x24));
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar18 + 0x34));
        iVar12 = *(int *)((long)plVar18 + 0x54);
        if (0 < (long)iVar12) {
          lVar15 = 0;
          iVar11 = 0;
          do {
            if ((char)*(byte *)(plVar18[0xb] + lVar15) < '\0') {
LAB_003b22eb:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            iVar11 = iVar11 + (uint)(*(byte *)(plVar18[0xb] + lVar15) < 10);
            lVar15 = lVar15 + 1;
          } while (iVar12 != lVar15);
        }
        printf("box =%6d  ",(ulong)(uint)(iVar12 - iVar11));
        printf("clp =%7d  ",(ulong)*(uint *)(plVar18 + 3));
        printf("obj =%7d  ",(ulong)*(uint *)((long)plVar18 + 0x54));
        pcVar16 = Abc_NamStr(*(Abc_Nam_t **)(*plVar18 + 0x10),(int)plVar18[1]);
        printf("%s ",pcVar16);
        iVar12 = (int)plVar18[2];
        if ((0 < (long)iVar12) && (iVar12 <= *(int *)(*plVar18 + 0x24))) {
          lVar15 = *(long *)(*plVar18 + 0x28);
          lVar20 = (long)iVar12 * 0xd0;
          pcVar16 = Abc_NamStr(*(Abc_Nam_t **)(*(long *)(lVar15 + lVar20) + 0x10),
                               *(int *)(lVar15 + 8 + lVar20));
          printf("-> %s",pcVar16);
        }
        putchar(10);
        bVar10 = (long)*(int *)((long)puVar9 + 0x24) <= (long)uVar21;
        uVar21 = uVar21 + 1;
        if (bVar10) {
          return 0;
        }
      } while( true );
    }
    if (iVar11 != 0x4d) goto LAB_003b225a;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_003b225a;
    }
    iVar11 = atoi(argv[globalUtilOptind]);
    local_40 = CONCAT44(extraout_var,iVar11);
    globalUtilOptind = iVar12 + 1;
    if (iVar11 < 0) {
LAB_003b225a:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_40);
      pcVar16 = "yes";
      if (!bVar10) {
        pcVar16 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar16);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}